

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pusher.cpp
# Opt level: O0

void P_SpawnPushers(void)

{
  int iVar1;
  bool bVar2;
  AActor *source;
  DPusher *pDVar3;
  MetaClass *pMVar4;
  size_t sVar5;
  line_t_conflict *local_b0;
  line_t_conflict *local_a0;
  line_t_conflict *local_90;
  line_t_conflict *local_80;
  undefined1 local_68 [8];
  FActorIterator iterator;
  AActor *thing_1;
  AActor *thing;
  FSectorTagIterator itr_2;
  FSectorTagIterator itr_1;
  FSectorTagIterator local_24;
  FSectorTagIterator itr;
  int s;
  line_t *l;
  int i;
  
  stack0xffffffffffffffe8 = lines;
  l._4_4_ = 0;
  do {
    if (numlines <= l._4_4_) {
      return;
    }
    iVar1 = stack0xffffffffffffffe8->special;
    if (iVar1 == 0xda) {
      sVar5 = (size_t)(uint)stack0xffffffffffffffe8->args[0];
      FSectorTagIterator::FSectorTagIterator(&local_24,stack0xffffffffffffffe8->args[0]);
      while (itr.searchtag = FSectorTagIterator::Next(&local_24), -1 < itr.searchtag) {
        pDVar3 = (DPusher *)DObject::operator_new((DObject *)0x70,sVar5);
        if (stack0xffffffffffffffe8->args[3] == 0) {
          local_80 = (line_t_conflict *)0x0;
        }
        else {
          local_80 = stack0xffffffffffffffe8;
        }
        sVar5 = 2;
        DPusher::DPusher(pDVar3,p_wind,(line_t *)local_80,stack0xffffffffffffffe8->args[1],
                         stack0xffffffffffffffe8->args[2],(AActor *)0x0,itr.searchtag);
      }
      stack0xffffffffffffffe8->special = 0;
    }
    else if (iVar1 == 0xdc) {
      sVar5 = (size_t)(uint)stack0xffffffffffffffe8->args[0];
      FSectorTagIterator::FSectorTagIterator(&itr_2,stack0xffffffffffffffe8->args[0]);
      while (itr.searchtag = FSectorTagIterator::Next(&itr_2), -1 < itr.searchtag) {
        pDVar3 = (DPusher *)DObject::operator_new((DObject *)0x70,sVar5);
        if (stack0xffffffffffffffe8->args[3] == 0) {
          local_90 = (line_t_conflict *)0x0;
        }
        else {
          local_90 = stack0xffffffffffffffe8;
        }
        sVar5 = 3;
        DPusher::DPusher(pDVar3,p_current,(line_t *)local_90,stack0xffffffffffffffe8->args[1],
                         stack0xffffffffffffffe8->args[2],(AActor *)0x0,itr.searchtag);
      }
      stack0xffffffffffffffe8->special = 0;
    }
    else if (iVar1 == 0xe3) {
      if (stack0xffffffffffffffe8->args[0] == 0) {
        FActorIterator::FActorIterator((FActorIterator *)local_68,stack0xffffffffffffffe8->args[1]);
LAB_005d815e:
        iterator._8_8_ = FActorIterator::Next((FActorIterator *)local_68);
        if ((AActor *)iterator._8_8_ != (AActor *)0x0) {
          pMVar4 = AActor::GetClass((AActor *)iterator._8_8_);
          sVar5 = 0x3c;
          bVar2 = FName::operator==(&(pMVar4->super_PClass).super_PNativeStruct.super_PStruct.
                                     super_PNamedType.TypeName,NAME_PointPusher);
          if (!bVar2) break;
          goto LAB_005d81bc;
        }
      }
      else {
        sVar5 = (size_t)(uint)stack0xffffffffffffffe8->args[0];
        FSectorTagIterator::FSectorTagIterator
                  ((FSectorTagIterator *)((long)&thing + 4),stack0xffffffffffffffe8->args[0]);
        while (itr.searchtag = FSectorTagIterator::Next((FSectorTagIterator *)((long)&thing + 4)),
              -1 < itr.searchtag) {
          source = P_GetPushThing(itr.searchtag);
          if ((source != (AActor *)0x0) &&
             ((stack0xffffffffffffffe8->args[1] == 0 ||
              (stack0xffffffffffffffe8->args[1] == source->tid)))) {
            pDVar3 = (DPusher *)DObject::operator_new((DObject *)0x70,sVar5);
            if (stack0xffffffffffffffe8->args[3] == 0) {
              local_a0 = (line_t_conflict *)0x0;
            }
            else {
              local_a0 = stack0xffffffffffffffe8;
            }
            sVar5 = 0;
            DPusher::DPusher(pDVar3,p_push,(line_t *)local_a0,stack0xffffffffffffffe8->args[2],0,
                             source,itr.searchtag);
          }
        }
      }
      stack0xffffffffffffffe8->special = 0;
    }
    l._4_4_ = l._4_4_ + 1;
    register0x00000000 = stack0xffffffffffffffe8 + 1;
  } while( true );
  pMVar4 = AActor::GetClass((AActor *)iterator._8_8_);
  sVar5 = 0x3d;
  bVar2 = FName::operator==(&(pMVar4->super_PClass).super_PNativeStruct.super_PStruct.
                             super_PNamedType.TypeName,NAME_PointPuller);
  if (bVar2) {
LAB_005d81bc:
    pDVar3 = (DPusher *)DObject::operator_new((DObject *)0x70,sVar5);
    if (stack0xffffffffffffffe8->args[3] == 0) {
      local_b0 = (line_t_conflict *)0x0;
    }
    else {
      local_b0 = stack0xffffffffffffffe8;
    }
    DPusher::DPusher(pDVar3,p_push,(line_t *)local_b0,stack0xffffffffffffffe8->args[2],0,
                     (AActor *)iterator._8_8_,
                     (int)((ulong)(*(long *)(iterator._8_8_ + 0x130) - (long)sectors) >> 3) *
                     0x7a44c6b);
  }
  goto LAB_005d815e;
}

Assistant:

void P_SpawnPushers ()
{
	int i;
	line_t *l = lines;
	int s;

	for (i = 0; i < numlines; i++, l++)
	{
		switch (l->special)
		{
		case Sector_SetWind: // wind
		{
			FSectorTagIterator itr(l->args[0]);
			while ((s = itr.Next()) >= 0)
				new DPusher(DPusher::p_wind, l->args[3] ? l : NULL, l->args[1], l->args[2], NULL, s);
			l->special = 0;
			break;
		}

		case Sector_SetCurrent: // current
		{
			FSectorTagIterator itr(l->args[0]);
			while ((s = itr.Next()) >= 0)
				new DPusher(DPusher::p_current, l->args[3] ? l : NULL, l->args[1], l->args[2], NULL, s);
			l->special = 0;
			break;
		}

		case PointPush_SetForce: // push/pull
			if (l->args[0]) {	// [RH] Find thing by sector
				FSectorTagIterator itr(l->args[0]);
				while ((s = itr.Next()) >= 0)
				{
					AActor *thing = P_GetPushThing (s);
					if (thing) {	// No MT_P* means no effect
						// [RH] Allow narrowing it down by tid
						if (!l->args[1] || l->args[1] == thing->tid)
							new DPusher (DPusher::p_push, l->args[3] ? l : NULL, l->args[2],
										 0, thing, s);
					}
				}
			} else {	// [RH] Find thing by tid
				AActor *thing;
				FActorIterator iterator (l->args[1]);

				while ( (thing = iterator.Next ()) )
				{
					if (thing->GetClass()->TypeName == NAME_PointPusher ||
						thing->GetClass()->TypeName == NAME_PointPuller)
					{
						new DPusher (DPusher::p_push, l->args[3] ? l : NULL, l->args[2],
									 0, thing, int(thing->Sector - sectors));
					}
				}
			}
			l->special = 0;
			break;
		}
	}
}